

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QAV.h
# Opt level: O2

void __thiscall
QAV<MonahanBGPlanner>::QAV
          (QAV<MonahanBGPlanner> *this,PlanningUnitDecPOMDPDiscrete *pu,
          MonahanBGPlanner *POMDPPlanner)

{
  long lVar1;
  E *this_00;
  PlanningUnitDecPOMDPDiscrete *pPVar2;
  
  (this->super_QFunctionJointBelief).super_QFunctionJointBeliefInterface =
       (QFunctionJointBeliefInterface)&PTR__QFunctionForDecPOMDPInterface_005dd1c8;
  QFunctionForDecPOMDP::QFunctionForDecPOMDP
            ((QFunctionForDecPOMDP *)&(this->super_QFunctionJointBelief).field_0x10,
             &PTR_construction_vtable_128__005dce30,pu);
  QFunctionJAOHInterface::QFunctionJAOHInterface
            ((QFunctionJAOHInterface *)&this->field_0x30,&PTR_construction_vtable_136__005dce58);
  QFunctionJointBelief::QFunctionJointBelief
            (&this->super_QFunctionJointBelief,&PTR_construction_vtable_136__005dcdc8,pu);
  (this->super_QFunctionJointBelief).super_QFunctionJointBeliefInterface =
       (QFunctionJointBeliefInterface)0x5dcb60;
  *(undefined8 *)&(this->super_QFunctionJointBelief).field_0x10 = 0x5dcc60;
  *(undefined8 *)&this->field_0x30 = 0x5dcd50;
  *(MonahanBGPlanner **)&(this->super_QFunctionJointBelief).field_0x8 = POMDPPlanner;
  lVar1 = *(long *)&(this->super_QFunctionJointBelief).field_0x18;
  if (lVar1 == 0) {
    lVar1 = *(long *)&(this->super_QFunctionJointBelief).field_0x20;
  }
  pPVar2 = (POMDPPlanner->super_MonahanPlanner).super_AlphaVectorPlanning._m_pu;
  if (pPVar2 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar2 = (POMDPPlanner->super_MonahanPlanner).super_AlphaVectorPlanning._m_puShared.px;
  }
  if (*(size_t *)(lVar1 + 0x18) ==
      (pPVar2->super_PlanningUnitMADPDiscrete).super_PlanningUnit._m_horizon) {
    return;
  }
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,"QAV ctor: horizons must match");
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

QAV(const PlanningUnitDecPOMDPDiscrete* pu, P* POMDPPlanner) :
        QFunctionForDecPOMDP(pu), //virtual base first
        QFunctionJointBelief(pu)
        {
            _m_p=POMDPPlanner;
            if(GetPU()->GetHorizon()!=POMDPPlanner->GetPU()->GetHorizon())
                throw(E("QAV ctor: horizons must match"));
        }